

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall MockHttpClient::MockHttpClient(MockHttpClient *this,Config *config)

{
  Config in_stack_ffffffffffffff38;
  
  Vault::Config::Config((Config *)&stack0xffffffffffffff40,config);
  Vault::HttpClient::HttpClient(&this->super_HttpClient,in_stack_ffffffffffffff38);
  Vault::Config::~Config((Config *)&stack0xffffffffffffff40);
  *(undefined ***)this = &PTR__MockHttpClient_00188f48;
  (this->response_).super__Optional_base<Vault::HttpResponse,_false,_false>._M_payload.
  super__Optional_payload<Vault::HttpResponse,_true,_false,_false>.
  super__Optional_payload_base<Vault::HttpResponse>._M_engaged = false;
  return;
}

Assistant:

explicit MockHttpClient(Vault::Config &config) : HttpClient(config) {}